

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall QFontCache::clear(QFontCache *this)

{
  EngineDataCache *this_00;
  EngineCache *this_01;
  QAtomicInt *pQVar1;
  QFontEngineData *this_02;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  int *piVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QFontEngine *engine;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->engineDataCache;
  iVar2._M_node = (_Base_ptr)QMap<QFontDef,_QFontEngineData_*>::begin(this_00);
  iVar3 = QMap<QFontDef,_QFontEngineData_*>::end(this_00);
  for (; (iterator)iVar2._M_node != iVar3.i._M_node;
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node)) {
    this_02 = (QFontEngineData *)iVar2._M_node[4]._M_parent;
    for (lVar7 = 1; lVar7 != 0xad; lVar7 = lVar7 + 1) {
      if (this_02->engines[lVar7 + -1] != (QFontEngine *)0x0) {
        LOCK();
        pQVar1 = &this_02->engines[lVar7 + -1]->ref;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (this_02->engines[lVar7 + -1] != (QFontEngine *)0x0)) {
          (*this_02->engines[lVar7 + -1]->_vptr_QFontEngine[1])();
        }
        this_02->engines[lVar7 + -1] = (QFontEngine *)0x0;
      }
    }
    LOCK();
    (this_02->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (this_02->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((this_02->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      QFontEngineData::~QFontEngineData(this_02);
      operator_delete(this_02,0x568);
    }
  }
  QMap<QFontDef,_QFontEngineData_*>::clear(this_00);
  this_01 = &this->engineCache;
  do {
    iVar4._M_node = (_Base_ptr)QMultiMap<QFontCache::Key,_QFontCache::Engine>::begin(this_01);
    iVar5 = QMultiMap<QFontCache::Key,_QFontCache::Engine>::end(this_01);
    bVar8 = false;
    for (; (iterator)iVar4._M_node != iVar5.i._M_node;
        iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
      engine = (QFontEngine *)iVar4._M_node[4]._M_left;
      if (engine != (QFontEngine *)0x0) {
        piVar6 = QHash<QFontEngine_*,_int>::operator[](&this->engineCacheCount,&engine);
        *piVar6 = *piVar6 + -1;
        LOCK();
        pQVar1 = &engine->ref;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          bVar8 = engine->m_type == Multi;
          (*engine->_vptr_QFontEngine[1])();
        }
        iVar4._M_node[4]._M_left = (_Base_ptr)0x0;
      }
    }
  } while (bVar8);
  QMultiMap<QFontCache::Key,_QFontCache::Engine>::clear(this_01);
  QHash<QFontEngine_*,_int>::clear(&this->engineCacheCount);
  this->total_cost = 0;
  this->max_cost = 0x1000;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::clear()
{
    {
        EngineDataCache::Iterator it = engineDataCache.begin(),
                                 end = engineDataCache.end();
        while (it != end) {
            QFontEngineData *data = it.value();
            for (int i = 0; i < QFontDatabasePrivate::ScriptCount; ++i) {
                if (data->engines[i]) {
                    if (!data->engines[i]->ref.deref()) {
                        Q_ASSERT(engineCacheCount.value(data->engines[i]) == 0);
                        delete data->engines[i];
                    }
                    data->engines[i] = nullptr;
                }
            }
            if (!data->ref.deref()) {
                delete data;
            } else {
                FC_DEBUG("QFontCache::clear: engineData %p still has refcount %d",
                         data, data->ref.loadRelaxed());
            }
            ++it;
        }
    }

    engineDataCache.clear();


    bool mightHaveEnginesLeftForCleanup;
    do {
        mightHaveEnginesLeftForCleanup = false;
        for (EngineCache::Iterator it = engineCache.begin(), end = engineCache.end();
             it != end; ++it) {
            QFontEngine *engine = it.value().data;
            if (engine) {
                const int cacheCount = --engineCacheCount[engine];
                Q_ASSERT(cacheCount >= 0);
                if (!engine->ref.deref()) {
                    Q_ASSERT(cacheCount == 0);
                    mightHaveEnginesLeftForCleanup = engine->type() == QFontEngine::Multi;
                    delete engine;
                } else if (cacheCount == 0) {
                    FC_DEBUG("QFontCache::clear: engine %p still has refcount %d",
                             engine, engine->ref.loadRelaxed());
                }
                it.value().data = nullptr;
            }
        }
    } while (mightHaveEnginesLeftForCleanup);

    engineCache.clear();
    engineCacheCount.clear();


    total_cost = 0;
    max_cost = min_cost;
}